

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# previewImageExamples.cpp
# Opt level: O2

void writeRgbaWithPreview1(char *fileName,Array2D<Imf_3_2::Rgba> *pixels,int width,int height)

{
  int iVar1;
  int previewHeight;
  int previewWidth;
  RgbaOutputFile file;
  half hStack_8e;
  half hStack_8c;
  half hStack_8a;
  Array2D<Imf_3_2::PreviewRgba> previewPixels;
  Header header;
  
  previewPixels._sizeX = 0;
  previewPixels._sizeY = 0;
  previewPixels._data = (PreviewRgba *)0x0;
  makePreviewImage(pixels,width,height,&previewPixels,&previewWidth,&previewHeight);
  _file = 0;
  hStack_8e._h = 0;
  hStack_8c._h = 0;
  hStack_8a._h = 0;
  Imf_3_2::Header::Header((Header *)0x3f800000,0x3f800000,&header,width,height,&file,0,3);
  Imf_3_2::PreviewImage::PreviewImage
            ((PreviewImage *)&file,previewWidth,previewHeight,previewPixels._data);
  Imf_3_2::Header::setPreviewImage((PreviewImage *)&header);
  Imf_3_2::PreviewImage::~PreviewImage((PreviewImage *)&file);
  iVar1 = Imf_3_2::globalThreadCount();
  Imf_3_2::RgbaOutputFile::RgbaOutputFile(&file,fileName,&header,WRITE_RGBA,iVar1);
  Imf_3_2::RgbaOutputFile::setFrameBuffer((Rgba *)&file,(ulong)pixels->_data,1);
  Imf_3_2::RgbaOutputFile::writePixels((int)&file);
  Imf_3_2::RgbaOutputFile::~RgbaOutputFile(&file);
  Imf_3_2::Header::~Header(&header);
  Imf_3_2::Array2D<Imf_3_2::PreviewRgba>::~Array2D(&previewPixels);
  return;
}

Assistant:

void
writeRgbaWithPreview1 (
    const char fileName[], const Array2D<Rgba>& pixels, int width, int height)
{
    //
    // Write an image file with a preview image, version 1:
    //
    // - generate the preview image by subsampling the main image
    // - generate a file header
    // - add the preview image to the file header
    // - open the file (this stores the header with the
    //   preview image in the file)
    // - describe the memory layout of the main image's pixels
    // - store the main image's pixels in the file
    //

    Array2D<PreviewRgba> previewPixels;
    int                  previewWidth;
    int                  previewHeight;

    makePreviewImage (
        pixels, width, height, previewPixels, previewWidth, previewHeight);

    Header header (width, height);

    header.setPreviewImage (
        PreviewImage (previewWidth, previewHeight, &previewPixels[0][0]));

    RgbaOutputFile file (fileName, header, WRITE_RGBA);
    file.setFrameBuffer (&pixels[0][0], 1, width);
    file.writePixels (height);
}